

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

bool __thiscall IntView<5>::setMax(IntView<5> *this,int64_t v,Reason r,bool channel)

{
  byte bVar1;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  
  bVar1 = (**(code **)(*(long *)*in_RDI + 0x70))
                    ((long *)*in_RDI,-(in_RSI - *(int *)((long)in_RDI + 0xc)),in_RDX,in_CL & 1);
  return (bool)(bVar1 & 1);
}

Assistant:

bool setMax(int64_t v, Reason r = nullptr, bool channel = true) const {
		if ((type & 4) != 0) {
			v -= b;
		}
		if ((type & 2) != 0) {
			v = v / a - static_cast<long long>(v % a < 0);
		}
		if ((type & 1) != 0) {
			return var->setMin(-v, r, channel);
		}
		return var->setMax(v, r, channel);
	}